

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  DesignPatternBuilder *this;
  DesignPatternDirector *this_00;
  undefined4 extraout_var;
  
  this = (DesignPatternBuilder *)operator_new(0x10);
  DesignPatternBuilder::DesignPatternBuilder(this);
  this_00 = (DesignPatternDirector *)operator_new(0x10);
  DesignPatternDirector::DesignPatternDirector(this_00,(DocBuilder *)this);
  DesignPatternDirector::construct(this_00);
  iVar1 = (*(this->super_DocBuilder)._vptr_DocBuilder[5])(this);
  if ((Doc *)CONCAT44(extraout_var,iVar1) != (Doc *)0x0) {
    Doc::printDoc((Doc *)CONCAT44(extraout_var,iVar1));
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	DocBuilder *builder = new DesignPatternBuilder();
	DesignPatternDirector *director = new DesignPatternDirector(builder);

	director->construct();
	Doc *doc = builder->getDoc();

	if (doc)
		doc->printDoc();

	return 0;
}